

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,cmValue value,char *helpString,CacheEntryType type)

{
  mapped_type *this_00;
  long lVar1;
  char *value_00;
  string *i;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string local_50;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  if (value.Value == (string *)0x0) {
    (this_00->Value)._M_string_length = 0;
    *(this_00->Value)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_assign((string *)this_00);
    this_00->Initialized = true;
  }
  this_00->Type = type;
  if (type - PATH < 2) {
    lVar1 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar1 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      arg._M_str = (this_00->Value)._M_dataplus._M_p;
      arg._M_len = (this_00->Value)._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_50,arg,false);
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this_00->Value)._M_string_length,0x81ca45);
      for (; local_50._M_dataplus._M_p != (pointer)local_50._M_string_length;
          local_50._M_dataplus._M_p = local_50._M_dataplus._M_p + 0x20) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_50._M_dataplus._M_p);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::_M_append
                  ((char *)this_00,(ulong)(((string *)local_50._M_dataplus._M_p)->_M_dataplus)._M_p)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HELPSTRING","");
  value_00 = "(This variable does not exist and should not be used)";
  if (helpString != (char *)0x0) {
    value_00 = helpString;
  }
  CacheEntry::SetProperty(this_00,&local_50,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key, cmValue value,
                                   const char* helpString,
                                   cmStateEnums::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  e.SetValue(value);
  e.Type = type;
  // make sure we only use unix style paths
  if (type == cmStateEnums::FILEPATH || type == cmStateEnums::PATH) {
    if (e.Value.find(';') != std::string::npos) {
      std::vector<std::string> paths = cmExpandedList(e.Value);
      const char* sep = "";
      e.Value = "";
      for (std::string& i : paths) {
        cmSystemTools::ConvertToUnixSlashes(i);
        e.Value += sep;
        e.Value += i;
        sep = ";";
      }
    } else {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
    }
  }
  e.SetProperty("HELPSTRING",
                helpString
                  ? helpString
                  : "(This variable does not exist and should not be used)");
}